

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestCoverageCommand::Clone(cmCTestCoverageCommand *this)

{
  cmCTestCoverageCommand *this_00;
  cmCTestCoverageCommand *ni;
  cmCTestCoverageCommand *this_local;
  
  this_00 = (cmCTestCoverageCommand *)operator_new(0xe0);
  cmCTestCoverageCommand(this_00);
  (this_00->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestCoverageCommand* ni = new cmCTestCoverageCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }